

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextV(char *fmt,__va_list_tag *args)

{
  ImGuiWindow *buf;
  char *text_end;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiTextFlags in_stack_000000f4;
  char *in_stack_000000f8;
  char *in_stack_00000100;
  char *in_stack_ffffffffffffffd8;
  
  buf = GetCurrentWindow();
  if ((buf->SkipItems & 1U) == 0) {
    ImFormatStringV((char *)buf,(size_t)GImGui,in_stack_ffffffffffffffd8,
                    (__va_list_tag *)GImGui->TempBuffer);
    TextEx(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  }
  return;
}

Assistant:

void ImGui::TextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const char* text_end = g.TempBuffer + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    TextEx(g.TempBuffer, text_end, ImGuiTextFlags_NoWidthForLargeClippedText);
}